

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void clearBits(quint8 *where,int start,int end)

{
  int iVar1;
  
  if (start == 0x80) {
    return;
  }
  where[start / 8] = where[start / 8] & (byte)(-1 << (8 - ((byte)start & 7) & 0x1f));
  iVar1 = (start + 7) / 8;
  memset(where + iVar1,0,(long)(0x10 - iVar1));
  return;
}

Assistant:

static void clearBits(quint8 *where, int start, int end)
{
    Q_ASSERT(end == 32 || end == 128);
    if (start == end)
        return;

    // for the byte where 'start' is, clear the lower bits only
    quint8 bytemask = 256 - (1 << (8 - (start & 7)));
    where[start / 8] &= bytemask;

    // for the tail part, clear everything
    memset(where + (start + 7) / 8, 0, end / 8 - (start + 7) / 8);
}